

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
EnrichableAnalyzerSubprocess::EmitBubble
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,EnrichableAnalyzerSubprocess *this,U64 packetId,U64 frameIndex,
          Frame *frame,string *channelName)

{
  allocator local_309;
  string *local_308;
  string value;
  stringstream outputStream;
  long local_2d0 [3];
  uint auStack_2b8 [88];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char bubbleText [256];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->enabled == true) && (this->featureBubble == true)) {
    local_308 = channelName;
    std::__cxx11::stringstream::stringstream((stringstream *)&outputStream);
    std::operator<<((ostream *)local_2d0,"bubble");
    std::operator<<((ostream *)local_2d0,'\t');
    *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) =
         *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2d0);
    std::operator<<((ostream *)local_2d0,'\t');
    *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) =
         *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2d0);
    std::operator<<((ostream *)local_2d0,'\t');
    *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) =
         *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<long_long>((longlong)local_2d0);
    std::operator<<((ostream *)local_2d0,'\t');
    *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) =
         *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<long_long>((longlong)local_2d0);
    std::operator<<((ostream *)local_2d0,'\t');
    *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) =
         *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2d0);
    std::operator<<((ostream *)local_2d0,'\t');
    *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) =
         *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2d0);
    std::operator<<((ostream *)local_2d0,'\t');
    std::operator<<((ostream *)local_2d0,(string *)local_308);
    std::operator<<((ostream *)local_2d0,'\t');
    *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) =
         *(uint *)((long)auStack_2b8 + *(long *)(local_2d0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_2d0);
    std::operator<<((ostream *)local_2d0,'\n');
    std::__cxx11::stringbuf::str();
    std::mutex::lock(&subprocessLock);
    SendOutputLine(this,value._M_dataplus._M_p,(uint)value._M_string_length);
    while( true ) {
      GetInputLine(this,bubbleText,0x100);
      if (bubbleText[0] == '\0') break;
      std::__cxx11::string::string((string *)&local_158,bubbleText,&local_309);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&subprocessLock);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::stringstream::~stringstream((stringstream *)&outputStream);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> EnrichableAnalyzerSubprocess::EmitBubble(U64 packetId, U64 frameIndex, Frame& frame, std::string channelName) {
	std::vector<std::string> bubbles;

	if(! (enabled && featureBubble)) {
		return bubbles;
	}

	std::stringstream outputStream;
	outputStream << BUBBLE_PREFIX;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << packetId;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frameIndex;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frame.mStartingSampleInclusive;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frame.mEndingSampleInclusive;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << (U64)frame.mType;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << (U64)frame.mFlags;
	outputStream << UNIT_SEPARATOR;
	outputStream << channelName;
	outputStream << UNIT_SEPARATOR;
	outputStream << std::hex << frame.mData1;
	outputStream << LINE_SEPARATOR;
	std::string value = outputStream.str();

	LockSubprocess();
	SendOutputLine(value.c_str(), value.length());
	char bubbleText[256];
	while(true) {
		GetInputLine(
			bubbleText,
			256
		);
		if(strlen(bubbleText) > 0) {
			bubbles.push_back(bubbleText);
		} else {
			break;
		}
	}
	UnlockSubprocess();

	return bubbles;
}